

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O2

QAbstractButton * __thiscall
QAbstractButtonPrivate::queryCheckedButton(QAbstractButtonPrivate *this)

{
  long lVar1;
  long lVar2;
  QAbstractButton *pQVar3;
  QAbstractButton *pQVar4;
  int i;
  undefined1 *puVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QAbstractButton_*> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->group == (QButtonGroup *)0x0) {
    pQVar3 = *(QAbstractButton **)&(this->super_QWidgetPrivate).field_0x8;
    local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.ptr = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
    queryButtonList((QList<QAbstractButton_*> *)&local_38,this);
    if (((this->field_0x28c & 8) == 0) || ((undefined1 *)local_38.size == (undefined1 *)0x1)) {
      pQVar4 = (QAbstractButton *)0x0;
    }
    else {
      puVar5 = (undefined1 *)0x0;
      do {
        if ((undefined1 *)local_38.size == puVar5) {
          pQVar4 = pQVar3;
          if ((this->field_0x28c & 2) == 0) {
            pQVar4 = (QAbstractButton *)0x0;
          }
          break;
        }
        pQVar4 = local_38.ptr[(long)puVar5];
        puVar5 = puVar5 + 1;
      } while ((pQVar4 == pQVar3) ||
              ((*(byte *)(*(long *)&(pQVar4->super_QWidget).field_0x8 + 0x28c) & 2) == 0));
    }
    QArrayDataPointer<QAbstractButton_*>::~QArrayDataPointer(&local_38);
  }
  else {
    lVar1 = *(long *)&this->group->field_0x8;
    lVar2 = *(long *)(lVar1 + 0x90);
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      pQVar4 = (QAbstractButton *)0x0;
    }
    else {
      pQVar4 = *(QAbstractButton **)(lVar1 + 0x98);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

QAbstractButton *QAbstractButtonPrivate::queryCheckedButton() const
{
#if QT_CONFIG(buttongroup)
    if (group)
        return group->d_func()->checkedButton;
#endif

    Q_Q(const QAbstractButton);
    QList<QAbstractButton *> buttonList = queryButtonList();
    if (!autoExclusive || buttonList.size() == 1) // no group
        return nullptr;

    for (int i = 0; i < buttonList.size(); ++i) {
        QAbstractButton *b = buttonList.at(i);
        if (b->d_func()->checked && b != q)
            return b;
    }
    return checked  ? const_cast<QAbstractButton *>(q) : nullptr;
}